

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

int voc_lookup_type(voccxdef *ctx,char *p,int len,int of_is_spec)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ushort **ppuVar6;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar7;
  vocdef *pvVar8;
  uint uVar9;
  
  cVar1 = *p;
  if (-1 < (long)cVar1) {
    ppuVar6 = __ctype_b_loc();
    if (((*ppuVar6)[cVar1] >> 8 & 1) != 0) {
      return 0x20;
    }
    if (((((*ppuVar6)[cVar1] >> 10 & 1) == 0) && (cVar1 != '-')) && (cVar1 != '\'')) {
      return 0x20;
    }
  }
  uVar4 = vochsh((uchar *)p,len);
  pvVar8 = (vocdef *)(ctx->voccxhsh + uVar4);
  uVar9 = 0;
  puVar7 = extraout_RDX;
  while (pvVar8 = pvVar8->vocnxt, pvVar8 != (vocdef *)0x0) {
    bVar2 = pvVar8->voclen;
    iVar5 = voceq((uchar *)p,len,pvVar8->voctxt,(uint)bVar2);
    puVar7 = extraout_RDX_00;
    if (iVar5 != 0) {
      uVar3 = pvVar8->vocwlst;
      if (uVar3 == 0xffffffff) {
        puVar7 = (uint *)0x0;
      }
      else {
        puVar7 = (uint *)((long)&ctx->voccxwp[(ulong)uVar3 / 2000]->vocwnxt +
                         (ulong)(uVar3 % 2000 << 3));
      }
      while (puVar7 != (uint *)0x0) {
        if ((*(byte *)((long)puVar7 + 7) & 8) == 0) {
          if ((ulong)*(byte *)((long)puVar7 + 6) == 7) {
            if ((uint)bVar2 == len) {
              uVar9 = uVar9 | 0x44;
            }
          }
          else {
            uVar9 = uVar9 | voctype[*(byte *)((long)puVar7 + 6)];
          }
        }
        uVar3 = *puVar7;
        puVar7 = (uint *)0x0;
        if (uVar3 != 0xffffffff) {
          puVar7 = (uint *)((long)&ctx->voccxwp[(ulong)uVar3 / 2000]->vocwnxt +
                           (ulong)(uVar3 % 2000 << 3));
        }
      }
    }
  }
  if ((of_is_spec != 0) && (uVar9 == 0)) {
    iVar5 = voc_check_special(ctx,p,(int)puVar7);
    uVar9 = (uint)(iVar5 != 0) << 5;
  }
  return uVar9;
}

Assistant:

static int voc_lookup_type(voccxdef *ctx, char *p, int len, int of_is_spec)
{
    int t;
    
    /* check for a special word */
    if (vocisspec(p))
    {
        /* it's a special word - this is its type */
        t = VOCT_SPEC;
    }
    else
    {
        vocwdef *vw;
        vocdef  *v;

        /*
         *   Now check the various entries of this word to get the word
         *   type flag bits.  The Noun and Adjective flags can be set for
         *   any word which matches this word in the first six letters (or
         *   more if more were provided by the player), but the Plural
         *   flag can only be set if the plural word matches exactly.
         *   Note that this pass only matches the first word in two-word
         *   verbs; the second word is considered later during the
         *   semantic analysis.  
         */
        for (t = 0, v = ctx->voccxhsh[vochsh((uchar *)p, len)] ; v != 0 ;
             v = v->vocnxt)
        {
            /* if this hash chain entry matches, add it to our types */
            if (voceq((uchar *)p, len, v->voctxt, v->voclen))
            {
                /* we have a match - look through relation list for word */
                for (vw = vocwget(ctx, v->vocwlst) ; vw != 0 ;
                     vw = vocwget(ctx, vw->vocwnxt))
                {
                    /* skip this word if it's been deleted */
                    if (vw->vocwflg & VOCFDEL)
                        continue;

                    /* we need a special check for plurals */
                    if (vw->vocwtyp == PRP_PLURAL)
                    {
                        /* plurals must be exact (non-truncated) match */
                        if (len == v->voclen)
                        {
                            /* plurals also count as nouns */
                            t |= (VOCT_NOUN | VOCT_PLURAL);
                        }
                    }
                    else
                    {
                        /* add this type bit to our type value */
                        t |= voctype[vw->vocwtyp];
                    }
                }
            }
        }
    }

    /* check for "of" if the caller wants us to */
    if (of_is_spec && t == 0 && voc_check_special(ctx, p, VOCW_OF))
        t = VOCT_SPEC;

    /* return the type */
    return t;
}